

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

size_t bloaty::anon_unknown_0::StringViewToSize(string_view str)

{
  string_view str_00;
  string_view value;
  bool bVar1;
  char *in_RSI;
  size_t in_RDI;
  size_t ret;
  Nonnull<unsigned_long_*> in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  Arg *in_stack_ffffffffffffff78;
  string_view in_stack_ffffffffffffff80;
  size_t local_18;
  
  str_00._M_len._4_4_ = in_stack_ffffffffffffff5c;
  str_00._M_len._0_4_ = in_stack_ffffffffffffff58;
  str_00._M_str = (char *)in_stack_ffffffffffffff60;
  bVar1 = absl::SimpleAtoi<unsigned_long>(str_00,in_stack_ffffffffffffff50);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff60,
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    value._M_str = in_RSI;
    value._M_len = in_RDI;
    absl::substitute_internal::Arg::Arg((Arg *)&stack0xffffffffffffff78,value);
    absl::Substitute_abi_cxx11_(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::c_str();
    Throw((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  return local_18;
}

Assistant:

size_t StringViewToSize(string_view str) {
  size_t ret;
  if (!absl::SimpleAtoi(str, &ret)) {
    THROWF("couldn't convert string '$0' to integer.", str);
  }
  return ret;
}